

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8.h
# Opt level: O0

void ncnn::padding_replicate_pack8_avx(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_8;
  int x_7;
  int x_6;
  __m256 _p_2;
  float *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  __m256 _p_1;
  int y_1;
  int x_2;
  int x_1;
  int x;
  __m256 _p;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_38c;
  int local_388;
  int local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float *local_358;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float *local_2d0;
  int local_2c4;
  float *local_2c0;
  float *local_2b8;
  
  local_2b8 = Mat::operator_cast_to_float_(in_RDI);
  local_2c0 = Mat::operator_cast_to_float_(in_RSI);
  for (local_2c4 = 0; local_2c4 < in_EDX; local_2c4 = local_2c4 + 1) {
    local_300 = *(undefined8 *)local_2b8;
    uStack_2f8 = *(undefined8 *)(local_2b8 + 2);
    uStack_2f0 = *(undefined8 *)(local_2b8 + 4);
    uStack_2e8 = *(undefined8 *)(local_2b8 + 6);
    for (local_304 = 0; local_304 < in_R8D; local_304 = local_304 + 1) {
      *(undefined8 *)local_2c0 = local_300;
      *(undefined8 *)(local_2c0 + 2) = uStack_2f8;
      *(undefined8 *)(local_2c0 + 4) = uStack_2f0;
      *(undefined8 *)(local_2c0 + 6) = uStack_2e8;
      local_2c0 = local_2c0 + 8;
    }
    local_2d0 = local_2b8;
    for (local_308 = 0; local_308 < in_RDI->w; local_308 = local_308 + 1) {
      local_300 = *(undefined8 *)local_2d0;
      uStack_2f8 = *(undefined8 *)(local_2d0 + 2);
      uStack_2f0 = *(undefined8 *)(local_2d0 + 4);
      uStack_2e8 = *(undefined8 *)(local_2d0 + 6);
      *(undefined8 *)local_2c0 = local_300;
      *(undefined8 *)(local_2c0 + 2) = uStack_2f8;
      *(undefined8 *)(local_2c0 + 4) = uStack_2f0;
      *(undefined8 *)(local_2c0 + 6) = uStack_2e8;
      local_2d0 = local_2d0 + 8;
      local_2c0 = local_2c0 + 8;
    }
    for (local_30c = 0; local_30c < in_R9D; local_30c = local_30c + 1) {
      *(undefined8 *)local_2c0 = local_300;
      *(undefined8 *)(local_2c0 + 2) = uStack_2f8;
      *(undefined8 *)(local_2c0 + 4) = uStack_2f0;
      *(undefined8 *)(local_2c0 + 6) = uStack_2e8;
      local_2c0 = local_2c0 + 8;
    }
  }
  for (local_310 = 0; local_310 < in_RDI->h; local_310 = local_310 + 1) {
    local_340 = *(undefined8 *)local_2b8;
    uStack_338 = *(undefined8 *)(local_2b8 + 2);
    uStack_330 = *(undefined8 *)(local_2b8 + 4);
    uStack_328 = *(undefined8 *)(local_2b8 + 6);
    for (local_344 = 0; local_344 < in_R8D; local_344 = local_344 + 1) {
      *(undefined8 *)local_2c0 = local_340;
      *(undefined8 *)(local_2c0 + 2) = uStack_338;
      *(undefined8 *)(local_2c0 + 4) = uStack_330;
      *(undefined8 *)(local_2c0 + 6) = uStack_328;
      local_2c0 = local_2c0 + 8;
    }
    for (local_348 = 0; local_348 < in_RDI->w; local_348 = local_348 + 1) {
      local_340 = *(undefined8 *)local_2b8;
      uStack_338 = *(undefined8 *)(local_2b8 + 2);
      uStack_330 = *(undefined8 *)(local_2b8 + 4);
      uStack_328 = *(undefined8 *)(local_2b8 + 6);
      *(undefined8 *)local_2c0 = local_340;
      *(undefined8 *)(local_2c0 + 2) = uStack_338;
      *(undefined8 *)(local_2c0 + 4) = uStack_330;
      *(undefined8 *)(local_2c0 + 6) = uStack_328;
      local_2b8 = local_2b8 + 8;
      local_2c0 = local_2c0 + 8;
    }
    for (local_34c = 0; local_34c < in_R9D; local_34c = local_34c + 1) {
      *(undefined8 *)local_2c0 = local_340;
      *(undefined8 *)(local_2c0 + 2) = uStack_338;
      *(undefined8 *)(local_2c0 + 4) = uStack_330;
      *(undefined8 *)(local_2c0 + 6) = uStack_328;
      local_2c0 = local_2c0 + 8;
    }
  }
  local_2b8 = local_2b8 + -(long)(in_RDI->w << 3);
  for (local_350 = 0; local_350 < in_ECX; local_350 = local_350 + 1) {
    local_380 = *(undefined8 *)local_2b8;
    uStack_378 = *(undefined8 *)(local_2b8 + 2);
    uStack_370 = *(undefined8 *)(local_2b8 + 4);
    uStack_368 = *(undefined8 *)(local_2b8 + 6);
    for (local_384 = 0; local_384 < in_R8D; local_384 = local_384 + 1) {
      *(undefined8 *)local_2c0 = local_380;
      *(undefined8 *)(local_2c0 + 2) = uStack_378;
      *(undefined8 *)(local_2c0 + 4) = uStack_370;
      *(undefined8 *)(local_2c0 + 6) = uStack_368;
      local_2c0 = local_2c0 + 8;
    }
    local_358 = local_2b8;
    for (local_388 = 0; local_388 < in_RDI->w; local_388 = local_388 + 1) {
      local_380 = *(undefined8 *)local_358;
      uStack_378 = *(undefined8 *)(local_358 + 2);
      uStack_370 = *(undefined8 *)(local_358 + 4);
      uStack_368 = *(undefined8 *)(local_358 + 6);
      *(undefined8 *)local_2c0 = local_380;
      *(undefined8 *)(local_2c0 + 2) = uStack_378;
      *(undefined8 *)(local_2c0 + 4) = uStack_370;
      *(undefined8 *)(local_2c0 + 6) = uStack_368;
      local_358 = local_358 + 8;
      local_2c0 = local_2c0 + 8;
    }
    for (local_38c = 0; local_38c < in_R9D; local_38c = local_38c + 1) {
      *(undefined8 *)local_2c0 = local_380;
      *(undefined8 *)(local_2c0 + 2) = uStack_378;
      *(undefined8 *)(local_2c0 + 4) = uStack_370;
      *(undefined8 *)(local_2c0 + 6) = uStack_368;
      local_2c0 = local_2c0 + 8;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack8_avx(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        __m256 _p = _mm256_loadu_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_loadu_ps(ptr0);
            _mm256_storeu_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        for (int x = 0; x < left; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
    }
    // fill bottom
    ptr -= src.w * 8;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        __m256 _p = _mm256_loadu_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm256_loadu_ps(ptr0);
            _mm256_storeu_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            _mm256_storeu_ps(outptr, _p);
            outptr += 8;
        }
    }
}